

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeWithFds
          (BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  AsyncPipe *pAVar1;
  ArrayPtr<const_int> fds_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_00;
  ArrayPtr<const_unsigned_char> data_00;
  Context *start;
  ArrayPtr<kj::OwnFd> *this_00;
  bool bVar2;
  Tag TVar3;
  int osErrorNumber;
  Tag TVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  OwnFd *this_01;
  Exception *this_02;
  size_t sVar7;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  *pOVar8;
  BlockedRead *this_03;
  size_t in_R9;
  ArrayPtr<const_unsigned_char> data_01;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_01;
  ArrayPtr<const_int> local_208;
  ArrayPtr<const_unsigned_char> *local_1f8;
  size_t sStack_1f0;
  uchar *local_1e8;
  ArrayPtr<const_unsigned_char> *pAStack_1e0;
  Retry *local_1d0;
  Retry *_kj_switch_done_3;
  Retry *retry;
  Done *local_1b8;
  Done *_kj_switch_done_2;
  Done *done;
  uchar *local_198;
  ArrayPtr<const_unsigned_char> *pAStack_190;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  local_180;
  undefined1 local_158 [8];
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
  _kj_switch_subject;
  Fault f_2;
  ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *_kj_switch_done_1;
  ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *streamBuffer;
  OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_100;
  Fault local_e8;
  Fault f_1;
  SyscallResult local_c4;
  undefined1 local_c0 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  unsigned_long i;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_long> *__range5;
  Disposer *local_80;
  Context *local_78;
  size_t count;
  ArrayPtr<kj::OwnFd> *_kj_switch_done;
  ArrayPtr<kj::OwnFd> *fdBuffer;
  OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  *_kj_switch_subject_1;
  Fault local_48;
  Fault f;
  DebugExpression<bool> _kjCondition;
  BlockedRead *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  this_03 = (BlockedRead *)data.ptr;
  f.exception._6_1_ = Canceler::isEmpty(&this_03->canceler);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3f0,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  fdBuffer = (ArrayPtr<kj::OwnFd> *)
             OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             ::_switchSubject(&this_03->capBuffer);
  TVar3 = OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
          ::which((OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                   *)fdBuffer);
  if (TVar3 == _variant0) {
    count = (size_t)OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                    ::get<kj::ArrayPtr<kj::OwnFd>>
                              ((OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                                *)fdBuffer);
    _kj_switch_done = (ArrayPtr<kj::OwnFd> *)count;
    while (count != 0) {
      local_80 = (Disposer *)ArrayPtr<kj::OwnFd>::size(_kj_switch_done);
      __range5 = (Range<unsigned_long> *)ArrayPtr<const_int>::size(&fds);
      local_78 = (Context *)
                 max<unsigned_long,unsigned_long>
                           ((unsigned_long *)&local_80,(unsigned_long *)&__range5);
      ___begin5 = zeroTo<unsigned_long>((unsigned_long)local_78);
      __end5 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin5);
      i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin5);
      while (bVar2 = Range<unsigned_long>::Iterator::operator==(&__end5,(Iterator *)&i),
            this_00 = _kj_switch_done, start = local_78, ((bVar2 ^ 0xffU) & 1) != 0) {
        puVar5 = Range<unsigned_long>::Iterator::operator*(&__end5);
        sVar7 = *puVar5;
        f_1.exception = (Exception *)local_c0;
        local_c4 = kj::_::Debug::
                   syscall<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::writeWithFds(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_1_>
                             ((anon_class_24_3_36d9a5e8 *)&f_1,false);
        pvVar6 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_c4);
        if (pvVar6 == (void *)0x0) {
          osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_c4);
          kj::_::Debug::Fault::Fault
                    (&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0x3fa,osErrorNumber,"_kj_fd = dup(fds[i])","");
          kj::_::Debug::Fault::fatal(&local_e8);
        }
        OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_c0);
        this_01 = ArrayPtr<kj::OwnFd>::operator[](_kj_switch_done,sVar7);
        OwnFd::operator=(this_01,(OwnFd *)&_kjSyscallResult);
        OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
        Range<unsigned_long>::Iterator::operator++(&__end5);
      }
      sVar7 = ArrayPtr<kj::OwnFd>::size(_kj_switch_done);
      _streamBuffer = ArrayPtr<kj::OwnFd>::slice(this_00,(size_t)start,sVar7);
      OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
      ::OneOf<kj::ArrayPtr<kj::OwnFd>,int>
                ((OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                  *)&local_100,(ArrayPtr<kj::OwnFd> *)&streamBuffer);
      OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
      ::operator=(&this_03->capBuffer,&local_100);
      OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
      ::~OneOf(&local_100);
      (this_03->readSoFar).capCount = (long)&local_78->file + (this_03->readSoFar).capCount;
      count = 0;
    }
  }
  else if (TVar3 == _variant1) {
    this_02 = (Exception *)
              OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
              ::get<kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                        ((OneOf<kj::ArrayPtr<kj::OwnFd>,kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                          *)fdBuffer);
    f_2.exception = this_02;
    while (f_2.exception != (Exception *)0x0) {
      sVar7 = ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::size
                        ((ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)this_02);
      if ((sVar7 != 0) && (sVar7 = ArrayPtr<const_int>::size(&fds), sVar7 != 0)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                  ((Fault *)((long)&_kj_switch_subject.field_1 + 0x20),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x404,FAILED,(char *)0x0,
                   "\"async pipe message was written with FDs attached, but corresponding read \" \"asked for streams, and we don\'t know how to convert here\""
                   ,(char (*) [130])
                    "async pipe message was written with FDs attached, but corresponding read asked for streams, and we don\'t know how to convert here"
                  );
        kj::_::Debug::Fault::fatal((Fault *)((long)&_kj_switch_subject.field_1 + 0x20));
      }
      f_2.exception = (Exception *)0x0;
    }
  }
  data_00.size_ = (size_t)moreData.ptr;
  data_00.ptr = (uchar *)data.size_;
  moreData_00.size_ = in_R9;
  moreData_00.ptr = (ArrayPtr<const_unsigned_char> *)moreData.size_;
  done = (Done *)moreData.size_;
  local_198 = (uchar *)data.size_;
  pAStack_190 = moreData.ptr;
  writeImpl(&local_180,this_03,data_00,moreData_00);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  ::_switchSubject((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                    *)local_158,&local_180);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  ::~OneOf(&local_180);
  pOVar8 = kj::_::
           NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
           ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                         *)local_158);
  TVar4 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
          ::which(pOVar8);
  if (TVar4 == _variant0) {
    pOVar8 = kj::_::
             NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
             ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                           *)local_158);
    local_1b8 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
                ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done>(pOVar8);
    _kj_switch_done_2 = local_1b8;
    if (local_1b8 == (Done *)0x0) {
      retry._4_4_ = 0x14;
    }
    else {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
      retry._4_4_ = 1;
    }
  }
  else {
    if (TVar4 == _variant1) {
      pOVar8 = kj::_::
               NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
               ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                             *)local_158);
      local_1d0 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
                  ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>(pOVar8);
      _kj_switch_done_3 = local_1d0;
      if (local_1d0 != (Retry *)0x0) {
        pAVar1 = this_03->pipe;
        local_1e8 = (local_1d0->data).ptr;
        pAStack_1e0 = (ArrayPtr<const_unsigned_char> *)(local_1d0->data).size_;
        local_1f8 = (local_1d0->moreData).ptr;
        sStack_1f0 = (local_1d0->moreData).size_;
        ArrayPtr<const_int>::ArrayPtr(&local_208,(void *)0x0);
        fds_00.size_ = local_208.size_;
        fds_00.ptr = local_208.ptr;
        data_01.size_ = (size_t)local_1e8;
        data_01.ptr = (uchar *)pAVar1;
        moreData_01.size_ = (size_t)local_1f8;
        moreData_01.ptr = pAStack_1e0;
        AsyncPipe::writeWithFds((AsyncPipe *)this,data_01,moreData_01,fds_00);
        retry._4_4_ = 1;
        goto LAB_008990d6;
      }
    }
    retry._4_4_ = 0;
  }
LAB_008990d6:
  kj::_::
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
  ::~NullableValue((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                    *)local_158);
  if ((retry._4_4_ != 0) && (retry._4_4_ == 1)) {
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::unreachable();
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                               ArrayPtr<const ArrayPtr<const byte>> moreData,
                               ArrayPtr<const int> fds) override {
#if __GNUC__ && !__clang__ && __GNUC__ >= 7
// GCC 7 decides the open-brace below is "misleadingly indented" as if it were guarded by the `for`
// that appears in the implementation of KJ_REQUIRE(). Shut up shut up shut up.
#pragma GCC diagnostic ignored "-Wmisleading-indentation"
#endif
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      {  // TODO(cleanup): Remove redundant braces when we update to C++17.
        KJ_SWITCH_ONEOF(capBuffer) {
          KJ_CASE_ONEOF(fdBuffer, ArrayPtr<OwnFd>) {
            size_t count = kj::max(fdBuffer.size(), fds.size());
            // Unfortunately, we have to dup() each FD, because the writer doesn't release ownership
            // by default.
            // TODO(perf): Should we add an ownership-releasing version of writeWithFds()?
            for (auto i: kj::zeroTo(count)) {
              fdBuffer[i] = KJ_SYSCALL_FD(dup(fds[i]));
            }
            capBuffer = fdBuffer.slice(count, fdBuffer.size());
            readSoFar.capCount += count;
          }
          KJ_CASE_ONEOF(streamBuffer, ArrayPtr<Own<AsyncCapabilityStream>>) {
            if (streamBuffer.size() > 0 && fds.size() > 0) {
              // TODO(someday): Use AsyncIoStream's `Maybe<int> getFd()` method?
              KJ_FAIL_REQUIRE(
                  "async pipe message was written with FDs attached, but corresponding read "
                  "asked for streams, and we don't know how to convert here");
            }
          }
        }
      }

      KJ_SWITCH_ONEOF(writeImpl(data, moreData)) {
        KJ_CASE_ONEOF(done, Done) {
          return READY_NOW;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          // Any leftover fds in `fds` are dropped on the floor, per contract.
          // TODO(cleanup): We use another writeWithFds() call here only because it accepts `data`
          //   and `moreData` directly. After the stream API refactor, we should be able to avoid
          //   this.
          return pipe.writeWithFds(retry.data, retry.moreData, nullptr);
        }
      }
      KJ_UNREACHABLE;
    }